

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitterByCenterTest.cpp
# Opt level: O3

void __thiscall
SplitterByCenter_testSplit_Test::~SplitterByCenter_testSplit_Test
          (SplitterByCenter_testSplit_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SplitterByCenter, testSplit)
{
    TVertices vertices = 
    {
        {3, 1, 0},
        {1, 5, 0},
        {5, 4, 0}
    };

    SplitterByCenter<KDop<16> > s(vertices, createBoundingVolume<KDop<16> >(vertices));
    TVertices left, right;
    s.split(left, right);

    EXPECT_EQ(2, left.size());
    EXPECT_EQ(1, right.size());
    EXPECT_EQ(SVertex(3, 1, 0), left[0]);
    EXPECT_EQ(SVertex(1, 5, 0), left[1]);
    EXPECT_EQ(SVertex(5, 4, 0), right[0]);
}